

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O0

void __thiscall
nuraft::snapshot_io_mgr::io_queue_elem::io_queue_elem
          (io_queue_elem *this,ptr<raft_server> *r,ptr<snapshot> *s,ptr<snapshot_sync_ctx> *c,
          ptr<peer> *p,
          function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
          *h)

{
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_RCX;
  shared_ptr<nuraft::peer> *in_RDX;
  long in_RDI;
  shared_ptr<nuraft::peer> *this_00;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *this_01;
  shared_ptr<nuraft::raft_server> *in_stack_ffffffffffffff90;
  
  std::shared_ptr<nuraft::raft_server>::shared_ptr
            (in_stack_ffffffffffffff90,(shared_ptr<nuraft::raft_server> *)in_RDX);
  this_00 = (shared_ptr<nuraft::peer> *)(in_RDI + 0x10);
  std::shared_ptr<nuraft::snapshot>::shared_ptr
            ((shared_ptr<nuraft::snapshot> *)this_00,(shared_ptr<nuraft::snapshot> *)in_RDX);
  this_01 = (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
             *)(in_RDI + 0x20);
  std::shared_ptr<nuraft::snapshot_sync_ctx>::shared_ptr
            ((shared_ptr<nuraft::snapshot_sync_ctx> *)this_00,
             (shared_ptr<nuraft::snapshot_sync_ctx> *)in_RDX);
  std::shared_ptr<nuraft::peer>::shared_ptr(this_00,in_RDX);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function(this_01,in_RCX);
  return;
}

Assistant:

io_queue_elem( ptr<raft_server> r,
                   ptr<snapshot> s,
                   ptr<snapshot_sync_ctx> c,
                   ptr<peer> p,
                   std::function< void(ptr<resp_msg>&, ptr<rpc_exception>&) >& h )
        : raft_(r)
        , snapshot_(s)
        , sync_ctx_(c)
        , dst_(p)
        , handler_(h)
        {}